

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asStructList
          (ListBuilder *__return_storage_ptr__,OrphanBuilder *this,StructSize elementSize)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  ushort uVar3;
  SegmentId id;
  CapTableBuilder *pCVar4;
  BuilderArena *pBVar5;
  uint uVar6;
  SegmentBuilder *pSVar7;
  SegmentBuilder *pSVar8;
  uint uVar9;
  undefined8 *puVar10;
  word *pwVar11;
  word *pwVar12;
  OrphanBuilder *pOVar13;
  byte bVar14;
  StructSize SVar15;
  WirePointer *pWVar16;
  WirePointer *src;
  int iVar17;
  SegmentBuilder **ppSVar18;
  ulong uVar19;
  WirePointer *pWVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  ushort uVar24;
  ulong uVar25;
  WirePointer *dst;
  AllocateResult AVar26;
  AllocateResult AVar27;
  Iterator __end5;
  Fault f;
  Iterator __end4;
  SegmentBuilder *local_e8;
  WirePointer *local_e0;
  WirePointer *local_b0;
  Fault local_a8;
  ulong local_a0;
  CapTableBuilder *local_98;
  ulong local_90;
  ListBuilder *local_88;
  ulong local_80;
  ulong local_78;
  OrphanBuilder *local_70;
  SegmentBuilder *local_68;
  ulong local_60;
  uint local_54;
  word *local_50;
  size_t local_48;
  ulong local_40;
  ulong local_38;
  
  uVar23 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  local_70 = this;
  if (id.value != 0 || uVar23 != 0) {
    pSVar8 = this->segment;
    pCVar4 = this->capTable;
    pBVar5 = (BuilderArena *)(pSVar8->super_SegmentReader).arena;
    if ((uVar23 & 3) == 2) {
      local_68 = BuilderArena::getSegment(pBVar5,id);
      uVar23 = (uint)(this->tag).content;
      pwVar11 = (local_68->super_SegmentReader).ptr.ptr;
      uVar22 = (ulong)(uVar23 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar11->content + uVar22);
      pOVar13 = (OrphanBuilder *)((long)&pwVar11[1].content + uVar22);
      if ((uVar23 & 4) == 0) {
        local_b0 = (WirePointer *)(&pOVar13->tag + ((int)(pOVar1->tag).content >> 2));
        pOVar13 = pOVar1;
      }
      else {
        local_68 = BuilderArena::getSegment
                             ((BuilderArena *)(local_68->super_SegmentReader).arena,
                              (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        local_b0 = (WirePointer *)
                   ((long)&((local_68->super_SegmentReader).ptr.ptr)->content +
                   (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      local_b0 = (WirePointer *)this->location;
      pOVar13 = this;
      local_68 = pSVar8;
    }
    if (local_68->readOnly == true) {
      SegmentBuilder::throwNotWritable(local_68);
    }
    if (((pOVar13->tag).content & 3) == 1) {
      uVar9 = (uint)elementSize >> 0x10;
      local_a0 = (ulong)uVar9;
      uVar23 = *(uint *)((long)&(pOVar13->tag).content + 4);
      bVar14 = (byte)uVar23 & 7;
      uVar24 = elementSize.data;
      local_98 = pCVar4;
      local_88 = __return_storage_ptr__;
      if (bVar14 == 7) {
        uVar23 = (uint)*(uint64_t *)&(local_b0->offsetAndKind).value;
        if ((uVar23 & 3) == 0) {
          pWVar16 = local_b0 + 1;
          uVar2 = *(ushort *)&local_b0->field_1;
          uVar3 = *(ushort *)((long)&local_b0->field_1 + 2);
          local_78 = (ulong)uVar3;
          uVar9 = (uint)uVar3 + (uint)uVar2;
          uVar23 = uVar23 >> 2 & 0x1fffffff;
          uVar22 = (ulong)uVar23;
          SVar15.pointers = 0;
          SVar15.data = uVar2;
          if (elementSize.pointers <= uVar3 && uVar24 <= uVar2) {
            __return_storage_ptr__->segment = local_68;
            __return_storage_ptr__->capTable = pCVar4;
            __return_storage_ptr__->ptr = (byte *)pWVar16;
            __return_storage_ptr__->elementCount = uVar23;
            __return_storage_ptr__->step = uVar9 * 0x40;
            __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
            __return_storage_ptr__->structPointerCount = uVar3;
            goto LAB_001cd748;
          }
          if (uVar2 <= uVar24) {
            SVar15 = elementSize;
          }
          if (elementSize.pointers < uVar3) {
            local_a0 = local_78;
          }
          local_54 = (uint)SVar15 & 0xffff;
          uVar23 = (int)local_a0 + local_54;
          uVar25 = uVar23 * uVar22;
          local_60 = CONCAT44(local_60._4_4_,(uint)uVar3);
          uVar19 = (ulong)uVar9;
          if (0x1ffffffe < uVar25) {
            local_80 = (ulong)uVar9;
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_a8);
            uVar19 = local_80;
          }
          if ((((this->tag).content & 3) == 2) &&
             (pSVar7 = BuilderArena::getSegment
                                 ((BuilderArena *)(pSVar8->super_SegmentReader).arena,
                                  (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
             pSVar7->readOnly == false)) {
            uVar9 = (uint)(this->tag).content;
            puVar10 = (undefined8 *)
                      ((long)&((pSVar7->super_SegmentReader).ptr.ptr)->content +
                      (ulong)(uVar9 & 0xfffffff8));
            if ((uVar9 & 4) == 0) {
              *puVar10 = 0;
            }
            else {
              *puVar10 = 0;
              puVar10[1] = 0;
            }
          }
          (this->tag).content = 0;
          iVar17 = (int)uVar25;
          uVar9 = iVar17 + 1;
          local_90 = uVar22;
          if (pBVar5 == (BuilderArena *)0x0) {
            if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
              WireHelpers::zeroObject(pSVar8,pCVar4,(WirePointer *)this);
            }
            pwVar11 = pSVar8->pos;
            if ((long)((long)(pSVar8->super_SegmentReader).ptr.ptr +
                      ((pSVar8->super_SegmentReader).ptr.size_ * 8 - (long)pwVar11)) >> 3 <
                (long)(ulong)uVar9) {
              pwVar11 = (word *)0x0;
            }
            else {
              pSVar8->pos = pwVar11 + uVar9;
            }
            AVar26.words = pwVar11;
            AVar26.segment = pSVar8;
            if (pwVar11 == (word *)0x0) {
              pBVar5 = (BuilderArena *)(pSVar8->super_SegmentReader).arena;
              local_80 = uVar19;
              if (0x1fffffff < iVar17 + 2U) {
                WireHelpers::allocate::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&local_a8);
              }
              AVar27 = BuilderArena::allocate(pBVar5,iVar17 + 2U);
              this = (OrphanBuilder *)AVar27.words;
              pSVar8 = AVar27.segment;
              *(uint *)&(local_70->tag).content =
                   (int)AVar27.words - *(int *)&(pSVar8->super_SegmentReader).ptr.ptr & 0xfffffff8U
                   | 2;
              *(uint *)((long)&(local_70->tag).content + 4) = (pSVar8->super_SegmentReader).id.value
              ;
              *(undefined4 *)&(this->tag).content = 1;
              AVar26.words = (word *)&this->segment;
              AVar26.segment = pSVar8;
              uVar19 = local_80;
              uVar22 = local_90;
            }
            else {
              *(uint *)&(this->tag).content =
                   ((uint)((ulong)((long)pwVar11 - (long)this) >> 1) & 0xfffffffc) - 3;
              uVar22 = local_90;
            }
          }
          else {
            AVar26 = BuilderArena::allocate(pBVar5,uVar9);
            *(undefined4 *)&(this->tag).content = 0xfffffffd;
          }
          pwVar12 = AVar26.words;
          local_e8 = AVar26.segment;
          *(int *)((long)&(this->tag).content + 4) = iVar17 * 8 + 7;
          *(int *)&pwVar12->content = (int)uVar22 * 4;
          *(StructDataWordCount *)((long)&pwVar12->content + 4) = SVar15.data;
          *(short *)((long)&pwVar12->content + 6) = (short)local_a0;
          pwVar11 = pwVar12 + 1;
          uVar25 = uVar19 & 0xffffffff;
          local_50 = pwVar11;
          if ((int)uVar22 != 0) {
            local_48 = (ulong)uVar2 * 8;
            pWVar20 = (WirePointer *)(pwVar12 + ((ulong)(uint)SVar15 & 0xffff) + 1);
            local_40 = (ulong)(uVar23 * 8);
            local_e0 = local_b0 + (ulong)uVar2 + 1;
            local_80 = (ulong)(uint)((int)uVar19 << 3);
            iVar17 = 0;
            local_38 = uVar19 & 0xffffffff;
            do {
              if (uVar2 != 0) {
                memcpy(pwVar11,pWVar16,local_48);
              }
              pSVar8 = local_68;
              src = local_e0;
              uVar22 = local_78;
              dst = pWVar20;
              if ((short)local_60 != 0) {
                do {
                  WireHelpers::transferPointer(local_e8,dst,pSVar8,src);
                  dst = dst + 1;
                  src = src + 1;
                  uVar22 = uVar22 - 1;
                } while (uVar22 != 0);
              }
              pwVar11 = pwVar11 + uVar23;
              pWVar16 = pWVar16 + local_38;
              iVar17 = iVar17 + 1;
              pWVar20 = (WirePointer *)((long)&(pWVar20->offsetAndKind).value + local_40);
              local_e0 = (WirePointer *)((long)&(local_e0->offsetAndKind).value + local_80);
              uVar22 = local_90;
              uVar25 = local_38;
            } while (iVar17 != (int)local_90);
          }
          if (0x1ffffffe < uVar25 * uVar22) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_a8);
          }
          this = local_70;
          __return_storage_ptr__ = local_88;
          pCVar4 = local_98;
          iVar17 = (int)(uVar25 * uVar22) + 1;
          if (iVar17 != 0) {
            memset(local_b0,0,(ulong)(uint)(iVar17 * 8));
          }
          __return_storage_ptr__->segment = local_e8;
          __return_storage_ptr__->capTable = pCVar4;
          __return_storage_ptr__->ptr = (byte *)local_50;
          __return_storage_ptr__->elementCount = (ListElementCount)uVar22;
          __return_storage_ptr__->step = uVar23 * 0x40;
          __return_storage_ptr__->structDataSize = local_54 << 6;
LAB_001cd64e:
          __return_storage_ptr__->structPointerCount = (StructPointerCount)local_a0;
          local_70 = this;
          goto LAB_001cd748;
        }
        asStructList();
      }
      else {
        uVar6 = uVar23 >> 3;
        uVar22 = (ulong)uVar6;
        if ((uVar23 & 7) == 0) {
          uVar9 = uVar9 + ((uint)elementSize & 0xffff);
          uVar22 = uVar9 * uVar22;
          if (0x1ffffffe < uVar22) {
            WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_a8);
          }
          if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
            WireHelpers::zeroObject(pSVar8,local_98,(WirePointer *)this);
          }
          ppSVar18 = (SegmentBuilder **)pSVar8->pos;
          uVar19 = uVar22 + 1 & 0xffffffff;
          if ((long)((long)(pSVar8->super_SegmentReader).ptr.ptr +
                    ((pSVar8->super_SegmentReader).ptr.size_ * 8 - (long)ppSVar18)) >> 3 <
              (long)uVar19) {
            ppSVar18 = (SegmentBuilder **)0x0;
          }
          else {
            pSVar8->pos = (word *)(ppSVar18 + uVar19);
          }
          if (ppSVar18 == (SegmentBuilder **)0x0) {
            uVar23 = (int)uVar22 + 2;
            pBVar5 = (BuilderArena *)(pSVar8->super_SegmentReader).arena;
            if (0x1fffffff < uVar23) {
              WireHelpers::allocate::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_a8);
            }
            AVar27 = BuilderArena::allocate(pBVar5,uVar23);
            this = (OrphanBuilder *)AVar27.words;
            pSVar8 = AVar27.segment;
            *(uint *)&(local_70->tag).content =
                 (int)AVar27.words - *(int *)&(pSVar8->super_SegmentReader).ptr.ptr & 0xfffffff8U |
                 2;
            *(uint *)((long)&(local_70->tag).content + 4) = (pSVar8->super_SegmentReader).id.value;
            *(undefined4 *)&(this->tag).content = 1;
            ppSVar18 = &this->segment;
          }
          else {
            *(uint *)&(this->tag).content =
                 ((uint)((ulong)((long)ppSVar18 - (long)this) >> 1) & 0xfffffffc) - 3;
          }
          *(int *)((long)&(this->tag).content + 4) = (int)uVar22 * 8 + 7;
          *(uint *)ppSVar18 = uVar6 * 4;
          *(ushort *)((long)ppSVar18 + 4) = uVar24;
          *(StructPointerCount *)((long)ppSVar18 + 6) = (StructPointerCount)local_a0;
          local_88->segment = pSVar8;
          local_88->capTable = local_98;
          local_88->ptr = (byte *)(ppSVar18 + 1);
          local_88->elementCount = uVar6;
          local_88->step = uVar9 * 0x40;
          local_88->structDataSize = ((uint)elementSize & 0xffff) << 6;
          local_88->structPointerCount = (StructPointerCount)local_a0;
          __return_storage_ptr__ = local_88;
          goto LAB_001cd748;
        }
        if (bVar14 != 1) {
          if (bVar14 == 6) {
            local_a0 = (ulong)(uVar9 + (uVar9 == 0));
          }
          else {
            elementSize = (StructSize)
                          (((uint)elementSize & 0xffff) + (uint)(((uint)elementSize & 0xffff) == 0))
            ;
          }
          uVar9 = *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)bVar14 * 4);
          local_90 = (ulong)((uint)elementSize & 0xffff);
          local_78 = (ulong)(((uint)local_a0 & 0xffff) + ((uint)elementSize & 0xffff));
          uVar19 = local_78 * uVar22;
          local_60 = uVar22;
          if (0x1ffffffe < uVar19) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_a8);
          }
          iVar17 = (int)uVar19;
          if ((((this->tag).content & 3) == 2) &&
             (pSVar7 = BuilderArena::getSegment
                                 ((BuilderArena *)(pSVar8->super_SegmentReader).arena,
                                  (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
             pSVar7->readOnly == false)) {
            uVar21 = (uint)(this->tag).content;
            puVar10 = (undefined8 *)
                      ((long)&((pSVar7->super_SegmentReader).ptr.ptr)->content +
                      (ulong)(uVar21 & 0xfffffff8));
            if ((uVar21 & 4) == 0) {
              *puVar10 = 0;
            }
            else {
              *puVar10 = 0;
              puVar10[1] = 0;
            }
          }
          (this->tag).content = 0;
          uVar21 = iVar17 + 1;
          pOVar13 = this;
          if (pBVar5 == (BuilderArena *)0x0) {
            if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
              WireHelpers::zeroObject(pSVar8,local_98,(WirePointer *)this);
            }
            pwVar11 = pSVar8->pos;
            if ((long)((long)(pSVar8->super_SegmentReader).ptr.ptr +
                      ((pSVar8->super_SegmentReader).ptr.size_ * 8 - (long)pwVar11)) >> 3 <
                (long)(ulong)uVar21) {
              pwVar11 = (word *)0x0;
            }
            else {
              pSVar8->pos = pwVar11 + uVar21;
            }
            AVar27.words = pwVar11;
            AVar27.segment = pSVar8;
            if (pwVar11 == (word *)0x0) {
              pBVar5 = (BuilderArena *)(pSVar8->super_SegmentReader).arena;
              if (0x1fffffff < iVar17 + 2U) {
                WireHelpers::allocate::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&local_a8);
              }
              AVar27 = BuilderArena::allocate(pBVar5,iVar17 + 2U);
              pOVar13 = (OrphanBuilder *)AVar27.words;
              pSVar8 = AVar27.segment;
              *(uint *)&(this->tag).content =
                   (int)AVar27.words - *(int *)&(pSVar8->super_SegmentReader).ptr.ptr & 0xfffffff8U
                   | 2;
              *(uint *)((long)&(this->tag).content + 4) = (pSVar8->super_SegmentReader).id.value;
              *(undefined4 *)&(pOVar13->tag).content = 1;
              AVar27.words = (word *)&pOVar13->segment;
              AVar27.segment = pSVar8;
            }
            else {
              *(uint *)&(this->tag).content =
                   ((uint)((ulong)((long)pwVar11 - (long)this) >> 1) & 0xfffffffc) - 3;
            }
          }
          else {
            AVar27 = BuilderArena::allocate(pBVar5,uVar21);
            *(undefined4 *)&(this->tag).content = 0xfffffffd;
          }
          pSVar8 = local_68;
          pwVar12 = AVar27.words;
          local_e8 = AVar27.segment;
          pwVar11 = pwVar12 + 1;
          *(int *)((long)&(pOVar13->tag).content + 4) = iVar17 * 8 + 7;
          *(uint *)&pwVar12->content = uVar6 * 4;
          *(StructDataWordCount *)((long)&pwVar12->content + 4) = elementSize.data;
          *(short *)((long)&pwVar12->content + 6) = (short)local_a0;
          iVar17 = (int)local_78;
          if (bVar14 == 6) {
            if (7 < uVar23) {
              pWVar16 = (WirePointer *)(pwVar11 + local_90);
              pWVar20 = local_b0;
              do {
                WireHelpers::transferPointer(local_e8,pWVar16,pSVar8,pWVar20);
                pWVar20 = pWVar20 + 1;
                pWVar16 = (WirePointer *)
                          ((long)&(pWVar16->offsetAndKind).value + (ulong)(uint)(iVar17 * 8));
                uVar23 = (int)uVar22 - 1;
                uVar22 = (ulong)uVar23;
              } while (uVar23 != 0);
            }
          }
          else if (7 < uVar23) {
            uVar19 = (ulong)(uVar9 >> 3);
            pWVar16 = local_b0;
            pwVar12 = pwVar11;
            do {
              if (0xfffffffffffffffb < (ulong)bVar14 - 6) {
                memcpy(pwVar12,pWVar16,uVar19);
              }
              pWVar16 = (WirePointer *)((long)&(pWVar16->offsetAndKind).value + uVar19);
              pwVar12 = (word *)((long)&pwVar12->content + (ulong)(uint)(iVar17 * 8));
              uVar23 = (int)uVar22 - 1;
              uVar22 = (ulong)uVar23;
            } while (uVar23 != 0);
          }
          uVar19 = ((uint)(bVar14 == 6) * 0x40 + uVar9) * local_60;
          uVar22 = uVar19 + 0x3f;
          if (0x7ffffff80 < uVar19) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_a8);
          }
          __return_storage_ptr__ = local_88;
          pCVar4 = local_98;
          if ((int)(uVar22 >> 6) != 0) {
            memset(local_b0,0,(ulong)((uint)(uVar22 >> 3) & 0xfffffff8));
          }
          __return_storage_ptr__->segment = local_e8;
          __return_storage_ptr__->capTable = pCVar4;
          __return_storage_ptr__->ptr = (byte *)pwVar11;
          __return_storage_ptr__->elementCount = uVar6;
          __return_storage_ptr__->step = (int)local_78 << 6;
          __return_storage_ptr__->structDataSize = (int)local_90 << 6;
          goto LAB_001cd64e;
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                  (&local_a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x603,FAILED,"oldSize != ElementSize::BIT",
                   "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                   ,(char (*) [106])
                    "Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                  );
        kj::_::Debug::Fault::~Fault(&local_a8);
        __return_storage_ptr__ = local_88;
      }
    }
    else {
      asStructList();
    }
  }
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
LAB_001cd748:
  __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
  pwVar11 = (word *)(__return_storage_ptr__->ptr + -8);
  if (__return_storage_ptr__->ptr == (byte *)0x0) {
    pwVar11 = (word *)0x0;
  }
  local_70->location = pwVar11;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder OrphanBuilder::asStructList(StructSize elementSize) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableStructListPointer(
      tagAsPtr(), location, segment, capTable, elementSize, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = result.getLocation();

  return result;
}